

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O3

void * uprv_calloc_63(size_t num,size_t size)

{
  int32_t *__s;
  void *pvVar1;
  size_t __size;
  
  __size = num * size;
  if (__size == 0) {
    __s = zeroMem;
  }
  else {
    if (pAlloc == (UMemAllocFn *)0x0) {
      __s = (int32_t *)malloc(__size);
    }
    else {
      __s = (int32_t *)(*pAlloc)(pContext,__size);
    }
    if (__s == (int32_t *)0x0) {
      return (void *)0x0;
    }
  }
  pvVar1 = memset(__s,0,__size);
  return pvVar1;
}

Assistant:

U_CAPI void * U_EXPORT2
uprv_calloc(size_t num, size_t size) {
    void *mem = NULL;
    size *= num;
    mem = uprv_malloc(size);
    if (mem) {
        uprv_memset(mem, 0, size);
    }
    return mem;
}